

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::SentencePieceText_SentencePiece
          (SentencePieceText_SentencePiece *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SentencePieceText_SentencePiece_002184a8;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  SharedCtor(this);
  return;
}

Assistant:

SentencePieceText_SentencePiece::SentencePieceText_SentencePiece(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SentencePieceText.SentencePiece)
}